

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O0

int If_ManImproveCutCost(If_Man_t *p,Vec_Ptr_t *vFront)

{
  int iVar1;
  void *pvVar2;
  undefined4 local_28;
  undefined4 local_24;
  int Counter;
  int i;
  If_Obj_t *pFanin;
  Vec_Ptr_t *vFront_local;
  If_Man_t *p_local;
  
  local_28 = 0;
  for (local_24 = 0; iVar1 = Vec_PtrSize(vFront), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar2 = Vec_PtrEntry(vFront,local_24);
    if (*(int *)((long)pvVar2 + 0xc) == 0) {
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

int If_ManImproveCutCost( If_Man_t * p, Vec_Ptr_t * vFront )
{
    If_Obj_t * pFanin;
    int i, Counter = 0;
    Vec_PtrForEachEntry( If_Obj_t *, vFront, pFanin, i )
        if ( pFanin->nRefs == 0 )
            Counter++;
    return Counter;
}